

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O1

optional<jbcoin::detail::STVar> *
jbcoin::STParsedJSONDetail::parseLeaf
          (optional<jbcoin::detail::STVar> *__return_storage_ptr__,string *json_name,
          string *fieldName,SField *name,Value *value,Value *error)

{
  char cVar1;
  ushort uVar2;
  pointer pcVar3;
  ValueHolder VVar4;
  undefined1 uVar5;
  bool bVar6;
  byte bVar7;
  uchar uVar8;
  unsigned_short uVar9;
  TxType TVar10;
  uint index;
  UInt UVar11;
  UInt UVar12;
  uint uVar13;
  Int IVar14;
  LedgerEntryType LVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  ostream *poVar17;
  Value *this;
  Value *this_00;
  ValueHolder *extraout_RAX;
  ValueHolder *extraout_RAX_00;
  ValueHolder *extraout_RAX_01;
  ValueHolder *extraout_RAX_02;
  ValueHolder *pVVar18;
  undefined8 uVar19;
  Value *pVVar20;
  undefined8 *puVar21;
  optional<jbcoin::TER> oVar22;
  uint *args_1;
  string *s;
  string *s_00;
  string *s_01;
  ValueHolder VVar23;
  char *pcVar24;
  char *pcVar25;
  _Alloc_hider _Var26;
  ulong __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  bool hasCurrency;
  optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> a;
  string element_name;
  string strValue;
  STVar st;
  STPath p;
  Value pathEl;
  AccountID uIssuer;
  AccountID uAccount;
  Currency uCurrency;
  ValueHolder local_3c8;
  ushort local_3c0;
  undefined6 uStack_3be;
  ValueHolder local_3b8 [2];
  bool local_3a5;
  uint local_3a4;
  byte local_39d;
  uint local_39c;
  undefined1 local_398 [16];
  undefined4 auStack_388 [4];
  undefined1 local_378 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_368;
  undefined1 local_358 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_338;
  uint32_t local_328 [6];
  ValueHolder local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [64];
  rval_reference_type local_2a8;
  ios_base aiStack_278 [264];
  ios_base *local_170;
  value_type local_168;
  Value local_148;
  base_uint<160UL,_jbcoin::detail::AccountIDTag> local_138;
  base_uint<160UL,_jbcoin::detail::AccountIDTag> local_118;
  base_uint<160UL,_jbcoin::detail::CurrencyTag> local_f8;
  ulong local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->super_type).m_initialized = false;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)SField::getField(fieldName);
  if (*(int *)paVar16 == sfInvalid) {
    unknown_field((STParsedJSONDetail *)local_2f8,json_name,fieldName);
LAB_001cde60:
    VVar23 = value->value_;
    (value->value_).string_ = (char *)local_2f8._0_8_;
    uVar2 = *(ushort *)&value->field_0x8;
    *(ushort *)&value->field_0x8 = uVar2 & 0xff00 | local_2f8._8_2_ & 0xff;
    *(ushort *)&value->field_0x8 = uVar2 & 0xfe00 | local_2f8._8_2_ & 0xff | local_2f8._8_2_ & 0x100
    ;
    local_2f8._8_8_ =
         CONCAT62(SUB86(local_2f8._8_8_,2),local_2f8._8_2_ & 0xfe00 | uVar2 & 0xff | uVar2 & 0x100);
    local_2f8._0_8_ = VVar23;
    goto LAB_001cf4f4;
  }
  args_1 = &switchD_001cdef4::switchdataD_00279430;
  switch(*(SerializedTypeID *)(paVar16->_M_local_buf + 4)) {
  case STI_UINT16:
    cVar1 = (char)name->fieldValue;
    if (cVar1 == '\x01') {
      uVar13 = Json::Value::asInt((Value *)name);
      if (0xffff < uVar13) {
        Throw<std::runtime_error,char_const(&)[19]>((char (*) [19])"Value out of range");
      }
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d95e0;
      local_2e8._0_2_ = (short)uVar13;
      local_2f8._8_8_ = paVar16;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      goto LAB_001ceca8;
    }
    if (cVar1 == '\x02') {
      UVar11 = Json::Value::asUInt((Value *)name);
      if (0xffff < UVar11) {
        Throw<std::runtime_error,char_const(&)[19]>((char (*) [19])"Value out of range");
      }
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d95e0;
      local_2e8._0_2_ = (short)UVar11;
      local_2f8._8_8_ = paVar16;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      goto LAB_001ceca8;
    }
    if (cVar1 != '\x04') {
      bad_type((STParsedJSONDetail *)local_2f8,json_name,fieldName);
      break;
    }
    Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_358._8_8_ ==
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) || (0xf5 < (byte)(*(char *)local_358._0_8_ - 0x3aU))) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_358._0_8_,(char *)(local_358._0_8_ + local_358._8_8_));
      uVar9 = beast::lexicalCastThrow<unsigned_short,std::__cxx11::string>(&local_d0);
      local_2f8._0_8_ = &PTR__STBase_002d95e0;
      local_2e8._0_2_ = uVar9;
      local_2f8._8_8_ = paVar16;
      local_2a8 = (rval_reference_type)local_2f8;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
      if (local_2a8 == (rval_reference_type)local_2f8) {
        puVar21 = *(undefined8 **)&local_2a8->d_;
LAB_001cf95e:
        (*(code *)*puVar21)();
      }
      else if (local_2a8 != (rval_reference_type)0x0) {
        puVar21 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
        goto LAB_001cf95e;
      }
      local_2a8 = (rval_reference_type)0x0;
      local_70.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
      _Var26._M_p = local_d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
LAB_001cf9a9:
        local_2a8 = (rval_reference_type)0x0;
        operator_delete(_Var26._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
LAB_001cf9b1:
      bVar6 = true;
      uVar13 = 0;
      goto LAB_001cfb02;
    }
    if (*(int *)paVar16 == sfTransactionType) {
      TxFormats::getInstance();
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_358._0_8_,(char *)(local_358._0_8_ + local_358._8_8_));
      TVar10 = KnownFormats<jbcoin::TxType>::findTypeByName
                         (&TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>,
                          &local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d95e0;
      local_2e8._0_2_ = (short)TVar10;
      local_2f8._8_8_ = paVar16;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
    }
    else {
      if (*(int *)paVar16 != sfLedgerEntryType) {
        invalid_data((STParsedJSONDetail *)local_2f8,json_name,fieldName);
        goto LAB_001cfa91;
      }
      LedgerFormats::getInstance();
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_358._0_8_,(char *)(local_358._0_8_ + local_358._8_8_));
      LVar15 = KnownFormats<jbcoin::LedgerEntryType>::findTypeByName
                         (&LedgerFormats::getInstance::instance.
                           super_KnownFormats<jbcoin::LedgerEntryType>,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d95e0;
      local_2e8._0_2_ = (short)LVar15;
      local_2f8._8_8_ = paVar16;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
    }
LAB_001cfade:
    if (local_2a8 == (rval_reference_type)local_2f8) {
      puVar21 = *(undefined8 **)&local_2a8->d_;
LAB_001cfafc:
      (*(code *)*puVar21)();
    }
    else if (local_2a8 != (rval_reference_type)0x0) {
      puVar21 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
      goto LAB_001cfafc;
    }
    bVar6 = true;
    uVar13 = 0;
LAB_001cfb02:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._0_8_ != &aStack_348) {
      operator_delete((void *)local_358._0_8_,(ulong)(aStack_348._M_allocated_capacity + 1));
    }
    goto LAB_001cfb23;
  case STI_UINT32:
    cVar1 = (char)name->fieldValue;
    if (cVar1 == '\x01') {
      IVar14 = Json::Value::asInt((Value *)name);
      if (IVar14 < 0) {
        Throw<std::runtime_error,char_const(&)[19]>((char (*) [19])"Value out of range");
      }
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d9660;
      local_2e8._0_4_ = IVar14;
      local_2f8._8_8_ = paVar16;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      goto LAB_001ceca8;
    }
    if (cVar1 == '\x02') {
      UVar11 = Json::Value::asUInt((Value *)name);
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d9660;
      local_2e8._0_4_ = UVar11;
      local_2f8._8_8_ = paVar16;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      goto LAB_001ceca8;
    }
    if (cVar1 != '\x04') {
      bad_type((STParsedJSONDetail *)local_2f8,json_name,fieldName);
      break;
    }
    Json::Value::asString_abi_cxx11_(&local_50,(Value *)name);
    local_2e8._0_4_ = beast::lexicalCastThrow<unsigned_int,std::__cxx11::string>(&local_50);
    local_2f8._0_8_ = &PTR__STBase_002d9660;
    local_2f8._8_8_ = paVar16;
    local_2a8 = (rval_reference_type)local_2f8;
    boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
              (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
    if (local_2a8 == (rval_reference_type)local_2f8) {
      puVar21 = *(undefined8 **)&local_2a8->d_;
LAB_001cf8d1:
      (*(code *)*puVar21)();
    }
    else if (local_2a8 != (rval_reference_type)0x0) {
      puVar21 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
      goto LAB_001cf8d1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
LAB_001cf247:
    local_2a8 = (rval_reference_type)0x0;
    pcVar25 = (char *)(local_50.field_2._M_allocated_capacity + 1);
LAB_001cf616:
    operator_delete(local_50._M_dataplus._M_p,(ulong)pcVar25);
    return __return_storage_ptr__;
  case STI_UINT64:
    cVar1 = (char)name->fieldValue;
    if (cVar1 == '\x01') {
      uVar13 = Json::Value::asInt((Value *)name);
      if ((int)uVar13 < 0) {
        Throw<std::runtime_error,char_const(&)[19]>((char (*) [19])"Value out of range");
      }
      local_2e8._0_8_ = ZEXT48(uVar13);
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d96c8;
      local_2f8._8_8_ = paVar16;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      goto LAB_001ceca8;
    }
    if (cVar1 == '\x02') {
      UVar11 = Json::Value::asUInt((Value *)name);
      local_2e8._0_8_ = ZEXT48(UVar11);
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d96c8;
      local_2f8._8_8_ = paVar16;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      goto LAB_001ceca8;
    }
    if (cVar1 == '\x04') {
      Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
      local_2e8._0_8_ = uintFromHex((string *)local_358);
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d96c8;
      local_2f8._8_8_ = paVar16;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      goto LAB_001cf117;
    }
    bad_type((STParsedJSONDetail *)local_2f8,json_name,fieldName);
    break;
  case STI_HASH128:
    if ((char)name->fieldValue == '\x04') {
      Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
      detail::make_stvar<jbcoin::STBitString<128ul>,jbcoin::SField_const&,std::__cxx11::string>
                ((STVar *)local_2f8,(detail *)paVar16->_M_local_buf,(SField *)local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
LAB_001cf117:
      if (local_2a8 == (rval_reference_type)local_2f8) {
        puVar21 = *(undefined8 **)&local_2a8->d_;
LAB_001cf21c:
        (*(code *)*puVar21)();
      }
      else if (local_2a8 != (rval_reference_type)0x0) {
        puVar21 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
        goto LAB_001cf21c;
      }
      local_50.field_2._M_allocated_capacity = aStack_348._M_allocated_capacity;
      local_50._M_dataplus._M_p = (pointer)local_358._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._0_8_ == &aStack_348) {
        return __return_storage_ptr__;
      }
      goto LAB_001cf247;
    }
    bad_type((STParsedJSONDetail *)local_2f8,json_name,fieldName);
    break;
  case STI_HASH256:
    if ((char)name->fieldValue == '\x04') {
      Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
      detail::make_stvar<jbcoin::STBitString<256ul>,jbcoin::SField_const&,std::__cxx11::string>
                ((STVar *)local_2f8,(detail *)paVar16->_M_local_buf,(SField *)local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
      goto LAB_001cf117;
    }
    bad_type((STParsedJSONDetail *)local_2f8,json_name,fieldName);
    break;
  case STI_AMOUNT:
    amountFromJson((STAmount *)local_358,(SField *)paVar16,(Value *)name);
    local_2a8 = (rval_reference_type)local_2f8;
    local_2f8._8_8_ = local_358._8_8_;
    local_2f8._0_8_ = &PTR__STBase_002d6f40;
    local_2e8._0_8_ = aStack_348._M_allocated_capacity;
    local_2e8._8_8_ = aStack_348._8_8_;
    local_2e8._16_8_ = aStack_338._M_allocated_capacity;
    local_2e8._24_8_ = aStack_338._8_8_;
    local_2e8._32_4_ = local_328[0];
    local_2e8._36_4_ = local_328[1];
    boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
              (&__return_storage_ptr__->super_type,local_2a8);
LAB_001ceca8:
    if (local_2a8 == (rval_reference_type)local_2f8) {
      puVar21 = *(undefined8 **)&local_2a8->d_;
    }
    else {
      if (local_2a8 == (rval_reference_type)0x0) {
        return __return_storage_ptr__;
      }
      puVar21 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
    }
    (*(code *)*puVar21)();
    return __return_storage_ptr__;
  case STI_VL:
    if ((char)name->fieldValue == '\x04') {
      Json::Value::asString_abi_cxx11_((string *)local_2f8,(Value *)name);
      strUnHex((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> *)local_358,
               (string *)local_2f8);
      if ((undefined1 *)local_2f8._0_8_ != local_2e8) {
        operator_delete((void *)local_2f8._0_8_,local_2e8._0_8_ + 1);
      }
      if (aStack_348._M_local_buf[8] == '\0') {
        Throw<std::invalid_argument,char_const(&)[13]>((char (*) [13])"invalid data");
      }
      local_2a8 = (rval_reference_type)0x0;
      local_2f8._0_8_ = &PTR__STBlob_002d7028;
      __n = local_358._8_8_ - local_358._0_8_;
      if (__n == 0) {
        local_2e8._0_8_ = (void *)0x0;
        local_2f8._8_8_ = paVar16;
      }
      else {
        local_2f8._8_8_ = paVar16;
        local_2e8._0_8_ = operator_new__(__n);
      }
      local_2e8._8_8_ = __n;
      if (local_358._8_8_ != local_358._0_8_) {
        memcpy((void *)local_2e8._0_8_,(void *)local_358._0_8_,__n);
      }
      local_2a8 = (rval_reference_type)local_2f8;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
      if (local_2a8 == (rval_reference_type)local_2f8) {
        puVar21 = *(undefined8 **)&local_2a8->d_;
      }
      else {
        if (local_2a8 == (rval_reference_type)0x0) goto LAB_001cf710;
        puVar21 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
      }
      (*(code *)*puVar21)();
LAB_001cf710:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_358._0_8_,aStack_348._M_allocated_capacity - local_358._0_8_);
      return __return_storage_ptr__;
    }
    bad_type((STParsedJSONDetail *)local_2f8,json_name,fieldName);
    break;
  case STI_ACCOUNT:
    if ((char)name->fieldValue == '\x04') {
      Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
      parseHexOrBase58<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
                ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)local_378,
                 (jbcoin *)local_358,s_01);
      bVar6 = local_378[0];
      if (local_378[0] == false) {
        invalid_data((STParsedJSONDetail *)local_2f8,json_name,fieldName);
        Json::Value::swap(value,(Value *)local_2f8);
        Json::Value::~Value((Value *)local_2f8);
      }
      else {
        local_2f8._0_8_ = &PTR__STBase_002d6e70;
        local_2e8._0_8_ = CONCAT44(local_378._8_4_,local_378._4_4_);
        local_2e8._16_8_ =
             CONCAT44(SUB84(local_2e8._16_8_,4),aStack_368._M_allocated_capacity._4_4_) &
             0xffffff00ffffffff;
        local_2f8._8_8_ = paVar16;
        local_2a8 = (rval_reference_type)local_2f8;
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
        if (local_2a8 == (rval_reference_type)local_2f8) {
          puVar21 = *(undefined8 **)&local_2a8->d_;
        }
        else {
          if (local_2a8 == (rval_reference_type)0x0) goto LAB_001cf88a;
          puVar21 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
        }
        (*(code *)*puVar21)();
      }
LAB_001cf88a:
      if (bVar6 != false) {
        local_378._0_4_ = local_378._0_4_ & 0xffffff00;
      }
      uVar13 = (uint)(bVar6 ^ 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._0_8_ != &aStack_348) {
        operator_delete((void *)local_358._0_8_,(ulong)(aStack_348._M_allocated_capacity + 1));
      }
      if (bVar6 != false) {
        return __return_storage_ptr__;
      }
      goto LAB_001cfb2b;
    }
    bad_type((STParsedJSONDetail *)local_2f8,json_name,fieldName);
    break;
  default:
    bad_type((STParsedJSONDetail *)local_2f8,json_name,fieldName);
    goto LAB_001cde60;
  case STI_UINT8:
    cVar1 = (char)name->fieldValue;
    if (cVar1 == '\x01') {
      IVar14 = Json::Value::asInt((Value *)name);
      if ((IVar14 < 0) || (IVar14 = Json::Value::asInt((Value *)name), 0xff < IVar14)) {
        out_of_range((STParsedJSONDetail *)local_2f8,json_name,fieldName);
        goto LAB_001cf589;
      }
      IVar14 = Json::Value::asInt((Value *)name);
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d9560;
      local_2e8[0] = (char)IVar14;
      local_2f8._8_8_ = paVar16;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
LAB_001cf932:
      if (local_2a8 == (rval_reference_type)local_2f8) {
        puVar21 = *(undefined8 **)&local_2a8->d_;
LAB_001cf950:
        (*(code *)*puVar21)();
      }
      else if (local_2a8 != (rval_reference_type)0x0) {
        puVar21 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
        goto LAB_001cf950;
      }
      bVar6 = true;
      uVar13 = 0;
    }
    else {
      if (cVar1 == '\x02') {
        UVar11 = Json::Value::asUInt((Value *)name);
        if (UVar11 < 0x100) {
          UVar11 = Json::Value::asUInt((Value *)name);
          local_2a8 = (rval_reference_type)local_2f8;
          local_2f8._0_8_ = &PTR__STBase_002d9560;
          local_2e8[0] = (char)UVar11;
          local_2f8._8_8_ = paVar16;
          boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                    (&__return_storage_ptr__->super_type,local_2a8);
          goto LAB_001cf932;
        }
        out_of_range((STParsedJSONDetail *)local_2f8,json_name,fieldName);
      }
      else {
        if (cVar1 == '\x04') {
          Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_358._8_8_ ==
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) || (0xf5 < (byte)(*(char *)local_358._0_8_ - 0x3aU))) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_358._0_8_,
                       (char *)(local_358._0_8_ + local_358._8_8_));
            uVar8 = beast::lexicalCastThrow<unsigned_char,std::__cxx11::string>(&local_70);
            local_2f8._0_8_ = &PTR__STBase_002d9560;
            local_2e8[0] = uVar8;
            local_2f8._8_8_ = paVar16;
            local_2a8 = (rval_reference_type)local_2f8;
            boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                      (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
            if (local_2a8 == (rval_reference_type)local_2f8) {
              puVar21 = *(undefined8 **)&local_2a8->d_;
LAB_001cf986:
              (*(code *)*puVar21)();
            }
            else if (local_2a8 != (rval_reference_type)0x0) {
              puVar21 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
              goto LAB_001cf986;
            }
            local_2a8 = (rval_reference_type)0x0;
            _Var26._M_p = local_70._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_001cf9a9;
            goto LAB_001cf9b1;
          }
          if (*(int *)paVar16 == sfTransactionResult) {
            oVar22 = transCode((jbcoin *)local_358,(string *)name);
            if ((((ulong)oVar22.super_type & 1) != 0) &&
               (-1 < (long)oVar22.super_type && oVar22.super_type.m_storage < 0x100)) {
              local_2a8 = (rval_reference_type)local_2f8;
              local_2f8._0_8_ = &PTR__STBase_002d9560;
              local_2e8[0] = (char)oVar22.super_type.m_storage;
              local_2f8._8_8_ = paVar16;
              boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                        (&__return_storage_ptr__->super_type,local_2a8);
              goto LAB_001cfade;
            }
            out_of_range((STParsedJSONDetail *)local_2f8,json_name,fieldName);
          }
          else {
            bad_type((STParsedJSONDetail *)local_2f8,json_name,fieldName);
          }
LAB_001cfa91:
          Json::Value::swap(value,(Value *)local_2f8);
          Json::Value::~Value((Value *)local_2f8);
          uVar13 = 1;
          bVar6 = false;
          goto LAB_001cfb02;
        }
        bad_type((STParsedJSONDetail *)local_2f8,json_name,fieldName);
      }
LAB_001cf589:
      Json::Value::swap(value,(Value *)local_2f8);
      Json::Value::~Value((Value *)local_2f8);
      uVar13 = 1;
      bVar6 = false;
    }
LAB_001cfb23:
    if (bVar6) {
      return __return_storage_ptr__;
    }
LAB_001cfb2b:
    if ((uVar13 & 1) != 0) {
      return __return_storage_ptr__;
    }
    boost::optional_detail::optional_base<jbcoin::detail::STVar>::destroy
              (&__return_storage_ptr__->super_type);
    return __return_storage_ptr__;
  case STI_HASH160:
    if ((char)name->fieldValue == '\x04') {
      Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
      detail::make_stvar<jbcoin::STBitString<160ul>,jbcoin::SField_const&,std::__cxx11::string>
                ((STVar *)local_2f8,(detail *)paVar16->_M_local_buf,(SField *)local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
      goto LAB_001cf117;
    }
    bad_type((STParsedJSONDetail *)local_2f8,json_name,fieldName);
    break;
  case STI_PATHSET:
    cVar1 = (char)name->fieldValue;
    if ((cVar1 == '\0') || (cVar1 == '\x06')) {
      local_358._0_8_ = &PTR__STPathSet_002d71d8;
      aStack_348._M_allocated_capacity = 0;
      aStack_348._8_8_ = (base_uint<256UL,_void> *)0x0;
      aStack_338._M_allocated_capacity = 0;
      local_358._8_8_ = paVar16;
      UVar11 = Json::Value::size((Value *)name);
      bVar7 = UVar11 != 0;
      if (UVar11 == 0) {
        local_3a4 = 0;
      }
      else {
        local_170 = aiStack_278;
        local_3a4 = 0;
        UVar11 = 0;
        local_308._8_8_ = name;
        do {
          local_39d = bVar7;
          local_168.mPath.
          super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_168.mPath.
          super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_168.mPath.
          super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_39c = UVar11;
          pVVar20 = Json::Value::operator[]((Value *)name,UVar11);
          if ((pVVar20->field_0x8 == '\x06') || (pVVar20->field_0x8 == '\0')) {
            local_d8 = (ulong)local_39c;
            uVar13 = 0;
            do {
              index = uVar13;
              pVVar20 = Json::Value::operator[]((Value *)local_308._8_8_,local_39c);
              UVar11 = Json::Value::size(pVVar20);
              if (UVar11 <= index) break;
              std::__cxx11::stringstream::stringstream((stringstream *)local_2f8);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2e8,(fieldName->_M_dataplus)._M_p,
                                   fieldName->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"[",1);
              poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"][",2);
              poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"]",1);
              local_3c8.string_ = (char *)local_3b8;
              pcVar3 = (json_name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3c8,pcVar3,pcVar3 + json_name->_M_string_length);
              std::__cxx11::string::append((char *)&local_3c8.int_);
              std::__cxx11::stringbuf::str();
              VVar23.real_ = 7.4109846876187e-323;
              if (local_3c8 != local_3b8) {
                VVar23 = local_3b8[0];
              }
              pcVar25 = (char *)(CONCAT44(local_398._12_4_,
                                          CONCAT22(local_398._10_2_,local_398._8_2_)) +
                                CONCAT62(uStack_3be,local_3c0));
              if (VVar23 < pcVar25) {
                pcVar24 = (char *)0xf;
                if ((undefined4 *)CONCAT44(local_398._4_4_,local_398._0_4_) != auStack_388) {
                  pcVar24 = (char *)CONCAT44(auStack_388[1],auStack_388[0]);
                }
                if (pcVar24 < pcVar25) goto LAB_001ce1e4;
                puVar21 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)local_398,0,(char *)0x0,(ulong)local_3c8);
              }
              else {
LAB_001ce1e4:
                puVar21 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_3c8.int_,
                                     CONCAT44(local_398._4_4_,local_398._0_4_));
              }
              local_378._0_8_ = &aStack_368;
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar21 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar21 == paVar16) {
                aStack_368._8_8_ = puVar21[3];
                aStack_368._M_allocated_capacity._0_4_ = (undefined4)paVar16->_M_allocated_capacity;
                aStack_368._M_allocated_capacity._4_4_ =
                     (undefined4)(paVar16->_M_allocated_capacity >> 0x20);
              }
              else {
                aStack_368._M_allocated_capacity._0_4_ = (undefined4)paVar16->_M_allocated_capacity;
                aStack_368._M_allocated_capacity._4_4_ =
                     (undefined4)(paVar16->_M_allocated_capacity >> 0x20);
                local_378._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar21;
              }
              local_378._8_4_ = (undefined4)puVar21[1];
              local_378._12_4_ = (undefined4)((ulong)puVar21[1] >> 0x20);
              *puVar21 = paVar16;
              puVar21[1] = 0;
              paVar16->_M_local_buf[0] = '\0';
              if ((undefined4 *)CONCAT44(local_398._4_4_,local_398._0_4_) != auStack_388) {
                operator_delete((undefined4 *)CONCAT44(local_398._4_4_,local_398._0_4_),
                                CONCAT44(auStack_388[1],auStack_388[0]) + 1);
              }
              if (local_3c8 != local_3b8) {
                operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
              }
              pVVar20 = Json::Value::operator[]((Value *)local_308._8_8_,local_39c);
              pVVar20 = Json::Value::operator[](pVVar20,index);
              Json::Value::Value(&local_148,pVVar20);
              if ((local_148._8_1_ == '\0') || (local_148._8_1_ == '\a')) {
                pVVar20 = Json::Value::resolveReference(&local_148,"account",false);
                this = Json::Value::resolveReference(&local_148,"currency",false);
                this_00 = Json::Value::resolveReference(&local_148,"issuer",false);
                local_3a5 = false;
                local_118.pn[4] = 0;
                local_118.pn[0] = 0;
                local_118.pn[1] = 0;
                local_118.pn[2] = 0;
                local_118.pn[3] = 0;
                local_138.pn[4] = 0;
                local_138.pn[0] = 0;
                local_138.pn[1] = 0;
                local_138.pn[2] = 0;
                local_138.pn[3] = 0;
                local_f8.pn[4] = 0;
                local_f8.pn[0] = 0;
                local_f8.pn[1] = 0;
                local_f8.pn[2] = 0;
                local_f8.pn[3] = 0;
                bVar6 = Json::Value::operator_cast_to_bool(pVVar20);
                if (!bVar6) goto LAB_001ce5c5;
                if (pVVar20->field_0x8 != '\x04') {
                  local_3c8.string_ = (char *)local_3b8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"account","")
                  ;
                  string_expected((STParsedJSONDetail *)local_398,(string *)local_378,
                                  (string *)&local_3c8);
                  goto LAB_001ce7e7;
                }
                Json::Value::asString_abi_cxx11_((string *)&local_3c8,pVVar20);
                bVar6 = base_uint<160UL,_jbcoin::detail::AccountIDTag>::SetHexExact
                                  (&local_118,local_3c8.string_);
                if (local_3c8 != local_3b8) {
                  operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                }
                if (!bVar6) {
                  Json::Value::asString_abi_cxx11_((string *)&local_3c8,pVVar20);
                  parseBase58<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
                            ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                             local_398,(jbcoin *)&local_3c8.bool_,s);
                  if (local_3c8 != local_3b8) {
                    operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                  }
                  uVar5 = local_398[0];
                  if ((STParsedJSONDetail)local_398[0] == (STParsedJSONDetail)0x1) {
                    local_118.pn[4] = auStack_388[1];
                    local_118.pn[1]._0_2_ = local_398._8_2_;
                    local_118.pn[0] = local_398._4_4_;
                    local_118.pn[1]._2_2_ = local_398._10_2_;
                    local_118.pn[3] = auStack_388[0];
                    local_118.pn[2] = local_398._12_4_;
                  }
                  else {
                    local_3c8.string_ = (char *)local_3b8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3c8,"account","");
                    invalid_data((STParsedJSONDetail *)&local_310.bool_,(string *)local_378,
                                 (string *)&local_3c8);
                    VVar23 = value->value_;
                    value->value_ = local_310;
                    uVar2 = *(ushort *)&value->field_0x8;
                    *(ushort *)&value->field_0x8 =
                         uVar2 & 0xff00 | local_308._M_allocated_capacity._0_2_ & 0xff;
                    *(ushort *)&value->field_0x8 =
                         uVar2 & 0xfe00 | local_308._M_allocated_capacity._0_2_ & 0xff |
                         local_308._M_allocated_capacity._0_2_ & 0x100;
                    local_308._M_allocated_capacity._0_2_ =
                         local_308._M_allocated_capacity._0_2_ & 0xfe00 | uVar2 & 0xff |
                         uVar2 & 0x100;
                    local_310 = VVar23;
                    Json::Value::~Value((Value *)&local_310);
                    pVVar18 = local_3b8;
                    if (local_3c8 != pVVar18) {
                      operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                      pVVar18 = extraout_RAX_00;
                    }
                    local_3a4 = (uint)CONCAT71((int7)((ulong)pVVar18 >> 8),1);
                  }
                  if ((STParsedJSONDetail)uVar5 != (STParsedJSONDetail)0x0) goto LAB_001ce5c5;
                  goto LAB_001ce87e;
                }
LAB_001ce5c5:
                bVar6 = Json::Value::operator_cast_to_bool(this);
                if (bVar6) {
                  if (this->field_0x8 == '\x04') {
                    local_3a5 = true;
                    Json::Value::asString_abi_cxx11_((string *)&local_3c8,this);
                    bVar6 = base_uint<160UL,_jbcoin::detail::CurrencyTag>::SetHexExact
                                      (&local_f8,local_3c8.string_);
                    if (local_3c8 != local_3b8) {
                      operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                    }
                    if (!bVar6) {
                      Json::Value::asString_abi_cxx11_((string *)&local_3c8,this);
                      bVar6 = to_currency(&local_f8,(string *)&local_3c8);
                      if (local_3c8 != local_3b8) {
                        operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                      }
                      if (!bVar6) {
                        local_3c8.string_ = (char *)local_3b8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_3c8,"currency","");
                        invalid_data((STParsedJSONDetail *)local_398,(string *)local_378,
                                     (string *)&local_3c8);
                        goto LAB_001ce7e7;
                      }
                    }
                    goto LAB_001ce66d;
                  }
                  local_3c8.string_ = (char *)local_3b8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3c8,"currency","");
                  string_expected((STParsedJSONDetail *)local_398,(string *)local_378,
                                  (string *)&local_3c8);
LAB_001ce7e7:
                  VVar23 = value->value_;
                  VVar4._4_4_ = local_398._4_4_;
                  VVar4.int_ = local_398._0_4_;
                  value->value_ = VVar4;
                  local_398._0_4_ = VVar23.int_;
                  local_398._4_4_ = VVar23._4_4_;
                  uVar2 = *(ushort *)&value->field_0x8;
                  *(ushort *)&value->field_0x8 = uVar2 & 0xff00 | local_398._8_2_ & 0xff;
                  *(ushort *)&value->field_0x8 =
                       uVar2 & 0xfe00 | local_398._8_2_ & 0xff | local_398._8_2_ & 0x100;
                  local_398._8_2_ = local_398._8_2_ & 0xfe00 | uVar2 & 0xff | uVar2 & 0x100;
                  Json::Value::~Value((Value *)local_398);
                  pVVar18 = local_3b8;
                  if (local_3c8 != pVVar18) {
                    operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                    pVVar18 = extraout_RAX_01;
                  }
                  goto LAB_001ce878;
                }
LAB_001ce66d:
                bVar6 = Json::Value::operator_cast_to_bool(this_00);
                if (bVar6) {
                  if (this_00->field_0x8 != '\x04') {
                    local_3c8.string_ = (char *)local_3b8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3c8,"issuer","");
                    string_expected((STParsedJSONDetail *)local_398,(string *)local_378,
                                    (string *)&local_3c8);
                    goto LAB_001ce7e7;
                  }
                  Json::Value::asString_abi_cxx11_((string *)&local_3c8,this_00);
                  bVar6 = base_uint<160UL,_jbcoin::detail::AccountIDTag>::SetHexExact
                                    (&local_138,local_3c8.string_);
                  if (local_3c8 != local_3b8) {
                    operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                  }
                  if (!bVar6) {
                    Json::Value::asString_abi_cxx11_((string *)&local_3c8,this_00);
                    parseBase58<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
                              ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                               local_398,(jbcoin *)&local_3c8.bool_,s_00);
                    if (local_3c8 != local_3b8) {
                      operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                    }
                    uVar5 = local_398[0];
                    if ((STParsedJSONDetail)local_398[0] == (STParsedJSONDetail)0x1) {
                      local_138.pn[4] = auStack_388[1];
                      local_138.pn[1]._0_2_ = local_398._8_2_;
                      local_138.pn[0] = local_398._4_4_;
                      local_138.pn[1]._2_2_ = local_398._10_2_;
                      local_138.pn[3] = auStack_388[0];
                      local_138.pn[2] = local_398._12_4_;
                    }
                    else {
                      local_3c8.string_ = (char *)local_3b8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_3c8,"issuer","");
                      invalid_data((STParsedJSONDetail *)&local_310.bool_,(string *)local_378,
                                   (string *)&local_3c8);
                      VVar23 = value->value_;
                      value->value_ = local_310;
                      uVar2 = *(ushort *)&value->field_0x8;
                      *(ushort *)&value->field_0x8 =
                           uVar2 & 0xff00 | local_308._M_allocated_capacity._0_2_ & 0xff;
                      *(ushort *)&value->field_0x8 =
                           uVar2 & 0xfe00 | local_308._M_allocated_capacity._0_2_ & 0xff |
                           local_308._M_allocated_capacity._0_2_ & 0x100;
                      local_308._M_allocated_capacity._0_2_ =
                           local_308._M_allocated_capacity._0_2_ & 0xfe00 | uVar2 & 0xff |
                           uVar2 & 0x100;
                      local_310 = VVar23;
                      Json::Value::~Value((Value *)&local_310);
                      pVVar18 = local_3b8;
                      if (local_3c8 != pVVar18) {
                        operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                        pVVar18 = extraout_RAX_02;
                      }
                      local_3a4 = (uint)CONCAT71((int7)((ulong)pVVar18 >> 8),1);
                    }
                    if ((STParsedJSONDetail)uVar5 == (STParsedJSONDetail)0x0) goto LAB_001ce87e;
                  }
                }
                bVar6 = true;
                std::vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>>::
                emplace_back<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>&,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,bool&>
                          ((vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>> *)
                           &local_168,&local_118,&local_f8,&local_138,&local_3a5);
              }
              else {
                not_an_object((STParsedJSONDetail *)&local_3c8.bool_,(string *)local_378);
                VVar23 = value->value_;
                value->value_ = local_3c8;
                uVar2 = *(ushort *)&value->field_0x8;
                *(ushort *)&value->field_0x8 = uVar2 & 0xff00 | local_3c0 & 0xff;
                *(ushort *)&value->field_0x8 = uVar2 & 0xfe00 | local_3c0 & 0xff | local_3c0 & 0x100
                ;
                local_3c0 = local_3c0 & 0xfe00 | uVar2 & 0xff | uVar2 & 0x100;
                local_3c8 = VVar23;
                Json::Value::~Value((Value *)&local_3c8);
                pVVar18 = extraout_RAX;
LAB_001ce878:
                local_3a4 = (uint)CONCAT71((int7)((ulong)pVVar18 >> 8),1);
LAB_001ce87e:
                bVar6 = false;
              }
              Json::Value::~Value(&local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._0_8_ != &aStack_368) {
                operator_delete((void *)local_378._0_8_,
                                CONCAT44(aStack_368._M_allocated_capacity._4_4_,
                                         aStack_368._M_allocated_capacity._0_4_) + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_2f8);
              std::ios_base::~ios_base(local_170);
              uVar13 = index + 1;
            } while (bVar6);
            if (index < UVar11) {
              bVar6 = false;
              name = (SField *)local_308._8_8_;
            }
            else {
              bVar6 = true;
              std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::push_back
                        ((vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)&aStack_348,
                         &local_168);
              name = (SField *)local_308._8_8_;
            }
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)local_2f8);
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2e8,(fieldName->_M_dataplus)._M_p,
                                 fieldName->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"[",1);
            poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar17,"]",1);
            std::__cxx11::stringbuf::str();
            array_expected((STParsedJSONDetail *)&local_3c8.bool_,json_name,(string *)local_378);
            VVar23 = value->value_;
            value->value_ = local_3c8;
            uVar2 = *(ushort *)&value->field_0x8;
            *(ushort *)&value->field_0x8 = uVar2 & 0xff00 | local_3c0 & 0xff;
            *(ushort *)&value->field_0x8 = uVar2 & 0xfe00 | local_3c0 & 0xff | local_3c0 & 0x100;
            local_3c0 = local_3c0 & 0xfe00 | uVar2 & 0xff | uVar2 & 0x100;
            local_3c8 = VVar23;
            Json::Value::~Value((Value *)&local_3c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._0_8_ != &aStack_368) {
              operator_delete((void *)local_378._0_8_,
                              CONCAT44(aStack_368._M_allocated_capacity._4_4_,
                                       aStack_368._M_allocated_capacity._0_4_) + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_2f8);
            uVar19 = std::ios_base::~ios_base(local_170);
            local_3a4 = (uint)CONCAT71((int7)((ulong)uVar19 >> 8),1);
            bVar6 = false;
          }
          if (local_168.mPath.
              super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_168.mPath.
                            super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_168.mPath.
                                  super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_168.mPath.
                                  super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          bVar7 = local_39d;
          if (!bVar6) break;
          UVar11 = local_39c + 1;
          UVar12 = Json::Value::size((Value *)name);
          bVar7 = UVar11 < UVar12;
        } while (UVar11 < UVar12);
      }
      if ((bVar7 & 1) == 0) {
        local_2f8._8_8_ = local_358._8_8_;
        local_2e8._0_8_ = aStack_348._M_allocated_capacity;
        local_2f8._0_8_ = &PTR__STPathSet_002d71d8;
        local_2e8._8_8_ = aStack_348._8_8_;
        local_2e8._16_8_ = aStack_338._M_allocated_capacity;
        aStack_338._M_allocated_capacity = 0;
        aStack_348._M_allocated_capacity = 0;
        aStack_348._8_8_ = 0;
        local_2a8 = (rval_reference_type)local_2f8;
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
        if (local_2a8 == (rval_reference_type)local_2f8) {
          puVar21 = *(undefined8 **)&local_2a8->d_;
        }
        else {
          if (local_2a8 == (rval_reference_type)0x0) goto LAB_001cf873;
          puVar21 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
        }
        (*(code *)*puVar21)();
LAB_001cf873:
        std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::~vector
                  ((vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)&aStack_348);
        return __return_storage_ptr__;
      }
      std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::~vector
                ((vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)&aStack_348);
      uVar13 = local_3a4;
      goto LAB_001cfb2b;
    }
    array_expected((STParsedJSONDetail *)local_2f8,json_name,fieldName);
    break;
  case STI_VECTOR256:
    cVar1 = (char)name->fieldValue;
    if ((cVar1 == '\0') || (cVar1 == '\x06')) {
      local_358._0_8_ = &PTR__STVector256_002d72a8;
      aStack_348._M_allocated_capacity = 0;
      aStack_348._8_8_ = (base_uint<256UL,_void> *)0x0;
      aStack_338._M_allocated_capacity = 0;
      local_358._8_8_ = paVar16;
      UVar11 = Json::Value::size((Value *)name);
      if (UVar11 != 0) {
        UVar11 = 0;
        do {
          local_2e8._0_8_ = 0;
          local_2e8._8_8_ = 0;
          local_2f8._0_8_ = 0;
          local_2f8._8_8_ = 0;
          pVVar20 = Json::Value::operator[]((Value *)name,UVar11);
          Json::Value::asString_abi_cxx11_((string *)local_378,pVVar20);
          base_uint<256UL,_void>::SetHex
                    ((base_uint<256UL,_void> *)local_2f8,
                     (char *)CONCAT44(local_378._4_4_,local_378._0_4_),false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_378._4_4_,local_378._0_4_) != &aStack_368) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_378._4_4_,local_378._0_4_),
                            CONCAT44(aStack_368._M_allocated_capacity._4_4_,
                                     aStack_368._M_allocated_capacity._0_4_) + 1);
          }
          if (aStack_348._8_8_ == aStack_338._M_allocated_capacity) {
            std::vector<jbcoin::base_uint<256ul,void>,std::allocator<jbcoin::base_uint<256ul,void>>>
            ::_M_realloc_insert<jbcoin::base_uint<256ul,void>const&>
                      ((vector<jbcoin::base_uint<256ul,void>,std::allocator<jbcoin::base_uint<256ul,void>>>
                        *)aStack_348._M_local_buf,(iterator)aStack_348._8_8_,
                       (base_uint<256UL,_void> *)local_2f8);
          }
          else {
            *(undefined8 *)(aStack_348._8_8_ + 0x10) = local_2e8._0_8_;
            *(undefined8 *)(aStack_348._8_8_ + 0x18) = local_2e8._8_8_;
            *(undefined8 *)aStack_348._8_8_ = local_2f8._0_8_;
            *(undefined8 *)(aStack_348._8_8_ + 8) = local_2f8._8_8_;
            aStack_348._8_8_ = aStack_348._8_8_ + 0x20;
          }
          UVar11 = UVar11 + 1;
          UVar12 = Json::Value::size((Value *)name);
        } while (UVar11 < UVar12);
      }
      local_2f8._8_8_ = local_358._8_8_;
      local_2e8._0_8_ = aStack_348._M_allocated_capacity;
      local_2f8._0_8_ = &PTR__STVector256_002d72a8;
      local_2e8._8_8_ = aStack_348._8_8_;
      local_2e8._16_8_ = aStack_338._M_allocated_capacity;
      aStack_338._M_allocated_capacity = 0;
      aStack_348._M_allocated_capacity = 0;
      aStack_348._8_8_ = (base_uint<256UL,_void> *)0x0;
      local_2a8 = (rval_reference_type)local_2f8;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
      if (local_2a8 == (rval_reference_type)local_2f8) {
        puVar21 = *(undefined8 **)&local_2a8->d_;
LAB_001cf5f0:
        (*(code *)*puVar21)();
      }
      else if (local_2a8 != (rval_reference_type)0x0) {
        puVar21 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
        goto LAB_001cf5f0;
      }
      local_358._0_8_ = &PTR__STVector256_002d72a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)aStack_348._M_allocated_capacity ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        return __return_storage_ptr__;
      }
      pcVar25 = (char *)(aStack_338._M_allocated_capacity - aStack_348._0_8_);
      local_50._M_dataplus._M_p = (pointer)aStack_348._M_allocated_capacity;
      goto LAB_001cf616;
    }
    array_expected((STParsedJSONDetail *)local_2f8,json_name,fieldName);
  }
  Json::Value::swap(value,(Value *)local_2f8);
LAB_001cf4f4:
  Json::Value::~Value((Value *)local_2f8);
  return __return_storage_ptr__;
}

Assistant:

static boost::optional<detail::STVar> parseLeaf (
    std::string const& json_name,
    std::string const& fieldName,
    SField const* name,
    Json::Value const& value,
    Json::Value& error)
{
    boost::optional <detail::STVar> ret;

    auto const& field = SField::getField (fieldName);

    if (field == sfInvalid)
    {
        error = unknown_field (json_name, fieldName);
        return ret;
    }

    switch (field.fieldType)
    {
    case STI_UINT8:
        try
        {
            constexpr auto minValue = std::numeric_limits<std::uint8_t>::min();
            constexpr auto maxValue = std::numeric_limits<std::uint8_t>::max();
            if (value.isString ())
            {
                std::string const strValue = value.asString();

                if (!strValue.empty() &&
                    ((strValue[0] < '0') || (strValue[0] > '9')))
                {
                    if (field == sfTransactionResult)
                    {
                        auto ter = transCode(strValue);

                        if (!ter || *ter < minValue || *ter > maxValue)
                        {
                            error = out_of_range(json_name, fieldName);
                            return ret;
                        }

                        ret = detail::make_stvar<STUInt8>(field,
                            static_cast<std::uint8_t>(*ter));
                    }
                    else
                    {
                        error = bad_type(json_name, fieldName);
                        return ret;
                    }
                }
                else
                {
                    ret = detail::make_stvar <STUInt8>(field,
                        beast::lexicalCastThrow <std::uint8_t>(strValue));
                }
            }
            else if (value.isInt ())
            {
                if (value.asInt () < minValue || value.asInt () > maxValue)
                {
                    error = out_of_range (json_name, fieldName);
                    return ret;
                }

                ret = detail::make_stvar <STUInt8> (field,
                    static_cast <std::uint8_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                if (value.asUInt () > maxValue)
                {
                    error = out_of_range (json_name, fieldName);
                    return ret;
                }

                ret = detail::make_stvar <STUInt8> (field,
                    static_cast <std::uint8_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }
        break;

    case STI_UINT16:
        try
        {
            if (value.isString ())
            {
                std::string const strValue = value.asString ();

                if (! strValue.empty () &&
                    ((strValue[0] < '0') || (strValue[0] > '9')))
                {
                    if (field == sfTransactionType)
                    {
                        TxType const txType (TxFormats::getInstance().
                            findTypeByName (strValue));

                        ret = detail::make_stvar <STUInt16> (field,
                            static_cast <std::uint16_t> (txType));

                        if (*name == sfGeneric)
                            name = &sfTransaction;
                    }
                    else if (field == sfLedgerEntryType)
                    {
                        LedgerEntryType const type (
                            LedgerFormats::getInstance().
                                findTypeByName (strValue));

                        ret = detail::make_stvar <STUInt16> (field,
                            static_cast <std::uint16_t> (type));

                        if (*name == sfGeneric)
                            name = &sfLedgerEntry;
                    }
                    else
                    {
                        error = invalid_data (json_name, fieldName);
                        return ret;
                    }
                }
                else
                {
                    ret = detail::make_stvar <STUInt16> (field,
                        beast::lexicalCastThrow <std::uint16_t> (strValue));
                }
            }
            else if (value.isInt ())
            {
                ret = detail::make_stvar <STUInt16> (field,
                    to_unsigned <std::uint16_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                ret = detail::make_stvar <STUInt16> (field,
                    to_unsigned <std::uint16_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_UINT32:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STUInt32> (field,
                    beast::lexicalCastThrow <std::uint32_t> (
                        value.asString ()));
            }
            else if (value.isInt ())
            {
                ret = detail::make_stvar <STUInt32> (field,
                    to_unsigned <std::uint32_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                ret = detail::make_stvar <STUInt32> (field,
                    static_cast <std::uint32_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_UINT64:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STUInt64> (field,
                    uintFromHex (value.asString ()));
            }
            else if (value.isInt ())
            {
                ret = detail::make_stvar <STUInt64> (field,
                    to_unsigned<std::uint64_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                ret = detail::make_stvar <STUInt64> (field,
                    static_cast <std::uint64_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_HASH128:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STHash128> (field, value.asString ());
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_HASH160:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STHash160> (field, value.asString ());
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_HASH256:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STHash256> (field, value.asString ());
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_VL:
        if (! value.isString ())
        {
            error = bad_type (json_name, fieldName);
            return ret;
        }

        try
        {
            std::pair<Blob, bool> vBlob (strUnHex (value.asString ()));

            if (! vBlob.second)
                Throw<std::invalid_argument> ("invalid data");

            ret = detail::make_stvar <STBlob> (field, vBlob.first.data (),
                                             vBlob.first.size ());
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_AMOUNT:
        try
        {
            ret = detail::make_stvar <STAmount> (amountFromJson (field, value));
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_VECTOR256:
        if (! value.isArray ())
        {
            error = array_expected (json_name, fieldName);
            return ret;
        }

        try
        {
            STVector256 tail (field);
            for (Json::UInt i = 0; value.isValidIndex (i); ++i)
            {
                uint256 s;
                s.SetHex (value[i].asString ());
                tail.push_back (s);
            }
            ret = detail::make_stvar <STVector256> (std::move (tail));
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_PATHSET:
        if (!value.isArray ())
        {
            error = array_expected (json_name, fieldName);
            return ret;
        }

        try
        {
            STPathSet tail (field);

            for (Json::UInt i = 0; value.isValidIndex (i); ++i)
            {
                STPath p;

                if (!value[i].isArray ())
                {
                    std::stringstream ss;
                    ss << fieldName << "[" << i << "]";
                    error = array_expected (json_name, ss.str ());
                    return ret;
                }

                for (Json::UInt j = 0; value[i].isValidIndex (j); ++j)
                {
                    std::stringstream ss;
                    ss << fieldName << "[" << i << "][" << j << "]";
                    std::string const element_name (
                        json_name + "." + ss.str());

                    // each element in this path has some combination of
                    // account, currency, or issuer

                    Json::Value pathEl = value[i][j];

                    if (!pathEl.isObject ())
                    {
                        error = not_an_object (element_name);
                        return ret;
                    }

                    Json::Value const& account  = pathEl["account"];
                    Json::Value const& currency = pathEl["currency"];
                    Json::Value const& issuer   = pathEl["issuer"];
                    bool hasCurrency            = false;
                    AccountID uAccount, uIssuer;
                    Currency uCurrency;

                    if (account)
                    {
                        // human account id
                        if (! account.isString ())
                        {
                            error = string_expected (element_name, "account");
                            return ret;
                        }

                        // If we have what looks like a 160-bit hex value, we
                        // set it, otherwise, we assume it's an AccountID
                        if (!uAccount.SetHexExact (account.asString ()))
                        {
                            auto const a = parseBase58<AccountID>(
                                account.asString());
                            if (! a)
                            {
                                error = invalid_data (element_name, "account");
                                return ret;
                            }
                            uAccount = *a;
                        }
                    }

                    if (currency)
                    {
                        // human currency
                        if (!currency.isString ())
                        {
                            error = string_expected (element_name, "currency");
                            return ret;
                        }

                        hasCurrency = true;

                        if (!uCurrency.SetHexExact (currency.asString ()))
                        {
                            if (!to_currency (uCurrency, currency.asString ()))
                            {
                                error = invalid_data (element_name, "currency");
                                return ret;
                            }
                        }
                    }

                    if (issuer)
                    {
                        // human account id
                        if (!issuer.isString ())
                        {
                            error = string_expected (element_name, "issuer");
                            return ret;
                        }

                        if (!uIssuer.SetHexExact (issuer.asString ()))
                        {
                            auto const a = parseBase58<AccountID>(
                                issuer.asString());
                            if (! a)
                            {
                                error = invalid_data (element_name, "issuer");
                                return ret;
                            }
                            uIssuer = *a;
                        }
                    }

                    p.emplace_back (uAccount, uCurrency, uIssuer, hasCurrency);
                }

                tail.push_back (p);
            }
            ret = detail::make_stvar <STPathSet> (std::move (tail));
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_ACCOUNT:
        {
            if (! value.isString ())
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }

            std::string const strValue = value.asString ();

            try
            {
                // VFALCO This needs careful auditing
                auto const account =
                    parseHexOrBase58<AccountID>(
                        strValue);
                if (! account)
                {
                    error = invalid_data (json_name, fieldName);
                    return ret;
                }
                ret = detail::make_stvar <STAccount>(
                    field, *account);
            }
            catch (std::exception const&)
            {
                error = invalid_data (json_name, fieldName);
                return ret;
            }
        }
        break;

    default:
        error = bad_type (json_name, fieldName);
        return ret;
    }

    return ret;
}